

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::MixedAssignmentVisitor::~MixedAssignmentVisitor(MixedAssignmentVisitor *this)

{
  MixedAssignmentVisitor *this_local;
  
  ~MixedAssignmentVisitor(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const vars = generator->get_vars();
        auto const ports = generator->get_port_names();
        for (const auto& var_name : vars) {
            checkout_assignment(generator, var_name);
        }
        for (const auto& port_name : ports) {
            checkout_assignment(generator, port_name);
        }
    }